

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip.c
# Opt level: O0

_Bool lrtr_ip_addr_is_zero(lrtr_ip_addr prefix)

{
  long in_FS_OFFSET;
  int in_stack_00000008;
  int in_stack_0000000c;
  _Bool local_11;
  
  if (in_stack_00000008 == 1) {
    if ((((in_stack_0000000c == 0) && (prefix.ver == LRTR_IPV4)) && (prefix.u.addr6.addr[0] == 0))
       && (prefix.u.addr6.addr[1] == 0)) {
      local_11 = true;
      goto LAB_0011bc28;
    }
  }
  else if (in_stack_0000000c == 0) {
    local_11 = true;
    goto LAB_0011bc28;
  }
  local_11 = false;
LAB_0011bc28:
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return local_11;
}

Assistant:

bool lrtr_ip_addr_is_zero(const struct lrtr_ip_addr prefix)
{
	if (prefix.ver == LRTR_IPV6) {
		if (prefix.u.addr6.addr[0] == 0 && prefix.u.addr6.addr[1] == 0 && prefix.u.addr6.addr[2] == 0 &&
		    prefix.u.addr6.addr[3] == 0) {
			return true;
		}
	} else if (prefix.u.addr4.addr == 0) {
		return true;
	}

	return false;
}